

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createPointSphere
          (Vec3fa *center,float radius,float pointRadius,size_t N,PointSubtype subtype,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  Vec3fx *pVVar4;
  pointer pvVar5;
  Vec3fa *ptr;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  uint uVar8;
  Node *pNVar9;
  PointSetNode *this;
  Vec3fx *pVVar10;
  Vec3fa *pVVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long *in_R8;
  uint uVar16;
  RTCGeometryType type;
  ulong uVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar27;
  float fVar28;
  undefined1 auVar24 [16];
  float fVar29;
  undefined1 auVar25 [16];
  Vec3fa VVar26;
  float fVar30;
  float fVar31;
  undefined4 in_XMM2_Db;
  float fVar32;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float phif;
  PointSubtype local_9c;
  Ref<embree::SceneGraph::MaterialNode> local_70;
  float local_64;
  float local_60;
  float local_5c;
  Node *local_58;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> local_50;
  
  iVar12 = (int)material;
  type = RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT;
  if (iVar12 != 2) {
    type = iVar12 == 1 | RTC_GEOMETRY_TYPE_SPHERE_POINT;
  }
  local_5c = pointRadius;
  this = (PointSetNode *)operator_new(0xb0);
  local_70.ptr = (MaterialNode *)*in_R8;
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  PointSetNode::PointSetNode(this,type,&local_70,(BBox1f)0x3f80000000000000,1);
  (*(this->super_Node).super_RefCount._vptr_RefCount[2])(this);
  local_58 = (Node *)center;
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  uVar8 = subtype * 2;
  pvVar3 = (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar17 = (ulong)((subtype + DISC) * uVar8);
  uVar13 = pvVar3->size_alloced;
  uVar14 = uVar13;
  if ((uVar13 < uVar17) && (uVar14 = uVar17, uVar15 = uVar13, uVar13 != 0)) {
    do {
      uVar14 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
      uVar15 = uVar14;
    } while (uVar14 < uVar17);
  }
  if (uVar17 < pvVar3->size_active) {
    pvVar3->size_active = uVar17;
  }
  if (uVar13 == uVar14) {
    pvVar3->size_active = uVar17;
  }
  else {
    pVVar4 = pvVar3->items;
    pVVar10 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
    pvVar3->items = pVVar10;
    if (pvVar3->size_active != 0) {
      lVar18 = 0;
      uVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pVVar4->field_0 + lVar18);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar18);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        uVar13 = uVar13 + 1;
        lVar18 = lVar18 + 0x10;
      } while (uVar13 < pvVar3->size_active);
    }
    alignedFree(pVVar4);
    pvVar3->size_active = uVar17;
    pvVar3->size_alloced = uVar14;
  }
  if (iVar12 == 2) {
    local_50.size_active = 0;
    local_50.size_alloced = 0;
    local_50.items = (Vec3fa *)0x0;
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                *)&this->normals,&local_50);
    alignedFree(local_50.items);
    pvVar5 = (this->normals).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = pvVar5->size_alloced;
    uVar14 = uVar13;
    if ((uVar13 < uVar17) && (uVar14 = uVar17, uVar15 = uVar13, uVar13 != 0)) {
      do {
        uVar14 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0);
        uVar15 = uVar14;
      } while (uVar14 < uVar17);
    }
    if (uVar17 < pvVar5->size_active) {
      pvVar5->size_active = uVar17;
    }
    if (uVar13 == uVar14) {
      pvVar5->size_active = uVar17;
    }
    else {
      ptr = pvVar5->items;
      pVVar11 = (Vec3fa *)alignedMalloc(uVar14 << 4,0x10);
      pvVar5->items = pVVar11;
      if (pvVar5->size_active != 0) {
        lVar18 = 0;
        uVar13 = 0;
        do {
          puVar1 = (undefined8 *)((long)&ptr->field_0 + lVar18);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar18);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          uVar13 = uVar13 + 1;
          lVar18 = lVar18 + 0x10;
        } while (uVar13 < pvVar5->size_active);
      }
      alignedFree(ptr);
      pvVar5->size_active = uVar17;
      pvVar5->size_alloced = uVar14;
    }
  }
  uVar13 = (ulong)uVar8;
  fVar19 = (float)uVar13;
  auVar24 = rcpss(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
  fVar30 = (float)subtype;
  local_60 = (2.0 - fVar19 * auVar24._0_4_) * auVar24._0_4_;
  auVar23._4_4_ = in_XMM2_Db;
  auVar23._0_4_ = fVar30;
  auVar23._8_4_ = in_XMM2_Dc;
  auVar23._12_4_ = in_XMM2_Dd;
  auVar24._4_4_ = in_XMM2_Db;
  auVar24._0_4_ = fVar30;
  auVar24._8_4_ = in_XMM2_Dc;
  auVar24._12_4_ = in_XMM2_Dd;
  auVar24 = rcpss(auVar23,auVar24);
  local_64 = (2.0 - fVar30 * auVar24._0_4_) * auVar24._0_4_;
  lVar18 = 0;
  local_9c = SPHERE;
  do {
    if (uVar8 != 0) {
      fVar19 = (float)local_9c * 3.1415927 * local_64;
      uVar14 = 0;
      do {
        fVar20 = ((float)(uVar14 & 0xffffffff) + (float)(uVar14 & 0xffffffff)) * 3.1415927 *
                 local_60;
        fVar30 = *(float *)N;
        fVar21 = sinf(fVar19);
        fVar22 = sinf(fVar20);
        uVar16 = (int)lVar18 + (int)uVar14;
        ((this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar16].field_0.m128[0] =
             fVar22 * fVar21 * radius + fVar30;
        fVar30 = *(float *)(N + 4);
        fVar21 = cosf(fVar19);
        ((this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar16].field_0.m128[1] =
             fVar21 * radius + fVar30;
        fVar30 = *(float *)(N + 8);
        fVar21 = sinf(fVar19);
        fVar20 = cosf(fVar20);
        ((this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar16].field_0.m128[2] =
             fVar21 * radius * fVar20 + fVar30;
        ((this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar16].field_0.m128[3] = local_5c;
        if (iVar12 == 2) {
          pVVar4 = ((this->positions).
                    super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->items + uVar16;
          fVar30 = (pVVar4->field_0).m128[0] - *(float *)N;
          fVar20 = (pVVar4->field_0).m128[1] - *(float *)(N + 4);
          fVar21 = (pVVar4->field_0).m128[2] - *(float *)(N + 8);
          fVar22 = (pVVar4->field_0).m128[3] - *(float *)(N + 0xc);
          fVar27 = fVar20 * fVar20;
          fVar28 = fVar21 * fVar21;
          fVar29 = fVar22 * fVar22;
          fVar31 = fVar27 + fVar30 * fVar30 + fVar28;
          fVar32 = fVar27 + fVar27 + fVar29;
          fVar28 = fVar27 + fVar28 + fVar28;
          fVar29 = fVar27 + fVar29 + fVar29;
          auVar25._4_4_ = fVar32;
          auVar25._0_4_ = fVar31;
          auVar25._8_4_ = fVar28;
          auVar25._12_4_ = fVar29;
          auVar6._4_4_ = fVar32;
          auVar6._0_4_ = fVar31;
          auVar6._8_4_ = fVar28;
          auVar6._12_4_ = fVar29;
          auVar24 = rsqrtss(auVar25,auVar6);
          fVar27 = auVar24._0_4_;
          fVar27 = fVar27 * fVar27 * fVar31 * -0.5 * fVar27 + fVar27 * 1.5;
          VVar26.field_0._0_4_ = fVar27 * fVar30;
          VVar26.field_0._4_4_ = fVar27 * fVar20;
          VVar26.field_0._8_4_ = fVar27 * fVar21;
          VVar26.field_0._12_4_ = fVar27 * fVar22;
          ((this->normals).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->items[uVar16].field_0 = VVar26.field_0;
        }
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    pNVar9 = local_58;
    local_9c = local_9c + DISC;
    lVar18 = lVar18 + uVar13;
  } while (local_9c <= subtype);
  (local_58->super_RefCount)._vptr_RefCount = (_func_int **)this;
  (*(this->super_Node).super_RefCount._vptr_RefCount[2])(this);
  (*(this->super_Node).super_RefCount._vptr_RefCount[3])(this);
  return (Ref<embree::SceneGraph::Node>)pNVar9;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createPointSphere (const Vec3fa& center, const float radius, const float pointRadius,
                                                       size_t N, PointSubtype subtype, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2 * numPhi;
    unsigned numVertices = numTheta * (numPhi + 1);

    RTCGeometryType type;
    switch (subtype) {
      case SPHERE:
        type = RTC_GEOMETRY_TYPE_SPHERE_POINT;
        break;
      case DISC:
        type = RTC_GEOMETRY_TYPE_DISC_POINT;
        break;
      case ORIENTED_DISC:
        type = RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT;
        break;
    }

    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(type, material, BBox1f(0,1), 1);
    mesh->positions[0].resize(numVertices);
    if (subtype == ORIENTED_DISC) {
      mesh->normals.push_back(avector<Vec3fa>());
      mesh->normals[0].resize(numVertices);
    }

    /* create sphere geometry */
    const float rcpNumTheta = rcp(float(numTheta));
    const float rcpNumPhi   = rcp(float(numPhi));
    for (unsigned int phi = 0; phi <= numPhi; phi++)
    {
      for (unsigned int theta = 0; theta < numTheta; theta++)
      {
        const float phif   = phi * float(pi) * rcpNumPhi;
        const float thetaf = theta * 2.0f * float(pi) * rcpNumTheta;
        mesh->positions[0][phi * numTheta + theta].x = center.x + radius * sin(phif) * sin(thetaf);
        mesh->positions[0][phi * numTheta + theta].y = center.y + radius * cos(phif);
        mesh->positions[0][phi * numTheta + theta].z = center.z + radius * sin(phif) * cos(thetaf);
        mesh->positions[0][phi * numTheta + theta].w = pointRadius;
        if (subtype == ORIENTED_DISC)
          mesh->normals[0][phi * numTheta + theta] =
            normalize(mesh->positions[0][phi * numTheta + theta] - center);
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }